

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_550beb::Db::parseFunctionType(Db *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  Node **ppNVar4;
  Node **ppNVar5;
  short *psVar6;
  bool bVar7;
  Qualifiers QVar8;
  NameType *pNVar9;
  Node *pNVar10;
  short *psVar11;
  Node *pNVar12;
  undefined1 uVar13;
  NodeArray NVar14;
  Node *T;
  Node *local_40;
  Qualifiers local_34;
  
  QVar8 = parseCVQualifiers(this);
  psVar11 = (short *)this->First;
  pcVar2 = this->Last;
  if (((ulong)((long)pcVar2 - (long)psVar11) < 2) || (*psVar11 != 0x6f44)) {
    psVar11 = (short *)this->First;
    if (((ulong)((long)pcVar2 - (long)psVar11) < 2) || (*psVar11 != 0x4f44)) {
      psVar11 = (short *)this->First;
      if (((ulong)((long)pcVar2 - (long)psVar11) < 2) || (*psVar11 != 0x7744)) {
        pNVar9 = (NameType *)0x0;
      }
      else {
        this->First = (char *)(psVar11 + 1);
        ppNVar4 = (this->Names).Last;
        ppNVar5 = (this->Names).First;
        while( true ) {
          pcVar2 = this->First;
          if ((pcVar2 == this->Last) || (*pcVar2 != 'E')) {
            bVar7 = false;
          }
          else {
            this->First = pcVar2 + 1;
            bVar7 = true;
          }
          if (bVar7) {
            NVar14 = popTrailingNodeArray(this,(long)ppNVar4 - (long)ppNVar5 >> 3);
            pNVar9 = (NameType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
            (pNVar9->super_Node).K = KDynamicExceptionSpec;
            (pNVar9->super_Node).RHSComponentCache = No;
            (pNVar9->super_Node).ArrayCache = No;
            (pNVar9->super_Node).FunctionCache = No;
            (pNVar9->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002178c8;
            (pNVar9->Name).First = (char *)NVar14.Elements;
            (pNVar9->Name).Last = (char *)NVar14.NumElements;
            goto LAB_001c0178;
          }
          local_40 = parseType(this);
          if (local_40 == (Node *)0x0) break;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
        }
        pNVar9 = (NameType *)0x0;
LAB_001c0178:
        if (!bVar7) {
          return (Node *)0x0;
        }
      }
    }
    else {
      this->First = (char *)(psVar11 + 1);
      pNVar10 = parseExpr(this);
      if (pNVar10 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar2 = this->First;
      if (pcVar2 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar2 != 'E') {
        return (Node *)0x0;
      }
      this->First = pcVar2 + 1;
      pNVar9 = (NameType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      (pNVar9->super_Node).K = KNoexceptSpec;
      (pNVar9->super_Node).RHSComponentCache = No;
      (pNVar9->super_Node).ArrayCache = No;
      (pNVar9->super_Node).FunctionCache = No;
      (pNVar9->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00217870;
      (pNVar9->Name).First = (char *)pNVar10;
    }
  }
  else {
    this->First = (char *)(psVar11 + 1);
    pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                       ((Db *)this,(char (*) [9])"noexcept");
  }
  psVar11 = (short *)this->First;
  pcVar2 = this->Last;
  if ((1 < (ulong)((long)pcVar2 - (long)psVar11)) && (*psVar11 == 0x7844)) {
    this->First = (char *)(psVar11 + 1);
  }
  pcVar3 = this->First;
  if ((pcVar3 != pcVar2) && (*pcVar3 == 'F')) {
    pcVar1 = pcVar3 + 1;
    this->First = pcVar1;
    if ((pcVar1 != pcVar2) && (*pcVar1 == 'Y')) {
      this->First = pcVar3 + 2;
    }
    pNVar10 = parseType(this);
    if (pNVar10 != (Node *)0x0) {
      ppNVar4 = (this->Names).Last;
      ppNVar5 = (this->Names).First;
      local_34 = QVar8;
LAB_001c01fd:
      while( true ) {
        psVar11 = (short *)this->First;
        psVar6 = (short *)this->Last;
        if (psVar11 == psVar6) break;
        if ((char)*psVar11 == 'E') {
          psVar11 = (short *)((long)psVar11 + 1);
          uVar13 = 0;
          goto LAB_001c028d;
        }
        if ((psVar11 == psVar6) || ((char)*psVar11 != 'v')) break;
        this->First = (char *)((long)psVar11 + 1);
      }
      if (((ulong)((long)psVar6 - (long)psVar11) < 2) || (*psVar11 != 0x4552)) {
        psVar11 = (short *)this->First;
        if (((ulong)((long)psVar6 - (long)psVar11) < 2) || (*psVar11 != 0x454f)) {
          local_40 = parseType(this);
          if (local_40 == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
          goto LAB_001c01fd;
        }
        psVar11 = psVar11 + 1;
        uVar13 = 2;
      }
      else {
        psVar11 = psVar11 + 1;
        uVar13 = 1;
      }
LAB_001c028d:
      this->First = (char *)psVar11;
      NVar14 = popTrailingNodeArray(this,(long)ppNVar4 - (long)ppNVar5 >> 3);
      pNVar12 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x38);
      pNVar12->K = KFunctionType;
      pNVar12->RHSComponentCache = Yes;
      pNVar12->ArrayCache = No;
      pNVar12->FunctionCache = Yes;
      pNVar12->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00217920;
      pNVar12[1]._vptr_Node = (_func_int **)pNVar10;
      *(NodeArray *)&pNVar12[1].K = NVar14;
      pNVar12[2].K = (undefined1)local_34;
      pNVar12[2].RHSComponentCache = local_34._1_1_;
      pNVar12[2].ArrayCache = local_34._2_1_;
      pNVar12[2].FunctionCache = local_34._3_1_;
      pNVar12[2].field_0xc = uVar13;
      pNVar12[3]._vptr_Node = (_func_int **)pNVar9;
      return pNVar12;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseFunctionType() {
  Qualifiers CVQuals = parseCVQualifiers();

  Node *ExceptionSpec = nullptr;
  if (consumeIf("Do")) {
    ExceptionSpec = make<NameType>("noexcept");
  } else if (consumeIf("DO")) {
    Node *E = parseExpr();
    if (E == nullptr || !consumeIf('E'))
      return nullptr;
    ExceptionSpec = make<NoexceptSpec>(E);
  } else if (consumeIf("Dw")) {
    size_t SpecsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *T = parseType();
      if (T == nullptr)
        return nullptr;
      Names.push_back(T);
    }
    ExceptionSpec =
      make<DynamicExceptionSpec>(popTrailingNodeArray(SpecsBegin));
  }

  consumeIf("Dx"); // transaction safe

  if (!consumeIf('F'))
    return nullptr;
  consumeIf('Y'); // extern "C"
  Node *ReturnType = parseType();
  if (ReturnType == nullptr)
    return nullptr;

  FunctionRefQual ReferenceQualifier = FrefQualNone;
  size_t ParamsBegin = Names.size();
  while (true) {
    if (consumeIf('E'))
      break;
    if (consumeIf('v'))
      continue;
    if (consumeIf("RE")) {
      ReferenceQualifier = FrefQualLValue;
      break;
    }
    if (consumeIf("OE")) {
      ReferenceQualifier = FrefQualRValue;
      break;
    }
    Node *T = parseType();
    if (T == nullptr)
      return nullptr;
    Names.push_back(T);
  }

  NodeArray Params = popTrailingNodeArray(ParamsBegin);
  return make<FunctionType>(ReturnType, Params, CVQuals,
                            ReferenceQualifier, ExceptionSpec);
}